

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

bool __thiscall QTextEditControl::canInsertFromMimeData(QTextEditControl *this,QMimeData *source)

{
  code *UNRECOVERED_JUMPTABLE;
  undefined1 uVar1;
  bool bVar2;
  QTextEdit *pQVar3;
  undefined8 extraout_RDX;
  
  pQVar3 = QtPrivate::qobject_cast_helper<QTextEdit*,QObject>
                     (*(QObject **)(*(long *)&(this->super_QWidgetTextControl).field_0x8 + 0x10));
  if (pQVar3 != (QTextEdit *)0x0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1d8
                   );
    uVar1 = (*UNRECOVERED_JUMPTABLE)(pQVar3,source,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return (bool)uVar1;
  }
  bVar2 = QWidgetTextControl::canInsertFromMimeData((QWidgetTextControl *)this,source);
  return bVar2;
}

Assistant:

virtual bool canInsertFromMimeData(const QMimeData *source) const override {
        QTextEdit *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::canInsertFromMimeData(source);
        return ed->canInsertFromMimeData(source);
    }